

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsHasOwnProperty(JsValueRef object,JsPropertyIdRef propertyId,bool *hasOwnProperty)

{
  uint propertyId_00;
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  BOOL BVar5;
  JsrtContext *currentContext;
  RecyclableObject *value;
  undefined4 *puVar6;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  JVar4 = CheckContext(currentContext,true,false);
  if (JVar4 != JsNoError) goto LAB_0037350f;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTHasOwnProperty
              (scriptContext->threadContext->TTDLog,
               (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,
               (PropertyRecord *)propertyId,object);
  }
  if (object == (JsValueRef)0x0) {
LAB_0037347b:
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    BVar5 = Js::JavascriptOperators::IsObject(object);
    if (BVar5 == 0) {
      JVar4 = JsErrorArgumentNotObject;
    }
    else {
      value = Js::VarTo<Js::RecyclableObject>(object);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        JVar4 = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00373489;
        object = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
      if (propertyId == (JsPropertyIdRef)0x0) goto LAB_0037347b;
      propertyId_00 = *(uint *)((long)propertyId + 8);
      JVar4 = JsErrorInvalidArgument;
      if (0xf < propertyId_00) {
        if (hasOwnProperty == (bool *)0x0) {
          JVar4 = JsErrorNullArgument;
        }
        else {
          *hasOwnProperty = false;
          JVar4 = JsNoError;
          BVar5 = Js::JavascriptOperators::OP_HasOwnProperty
                            (object,propertyId_00,scriptContext,(PropertyString *)0x0);
          *hasOwnProperty = BVar5 != 0;
        }
      }
    }
  }
LAB_00373489:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (((JVar4 - JsErrorNoCurrentContext < 7) &&
      ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                       ,0xcc,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
LAB_0037350f:
  if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
    if (*(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject + 4) != -1) {
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    *(JsErrorCode *)
     ((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar4;
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsHasOwnProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId,
    _Out_ bool *hasOwnProperty)
{
    return ContextAPIWrapper<true>([&](Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTHasOwnProperty, (const Js::PropertyRecord *)propertyId, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(hasOwnProperty);
        *hasOwnProperty = false;

        return JsHasOwnPropertyCommon(scriptContext, object,
            (const Js::PropertyRecord *)propertyId, hasOwnProperty, nullptr);
    });
}